

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Product<Eigen::PermutationMatrix<-1,_-1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_2>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Matrix<double,_3,_3,_0,_3,_3> *dst,SrcXprType *src,assign_op<double,_double> *param_3)

{
  long cols;
  long rows;
  LhsNested perm;
  
  perm = src->m_lhs;
  cols = (src->m_rhs).m_cols.m_value;
  rows = (perm->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
  if (cols != 3 || rows != 3) {
    PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::resize
              (&dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,rows,cols);
    perm = src->m_lhs;
  }
  permutation_matrix_product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>,1,false,Eigen::DenseShape>
  ::run<Eigen::Matrix<double,3,3,0,3,3>,Eigen::PermutationMatrix<_1,_1,int>>(dst,perm,&src->m_rhs);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }